

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  short sVar2;
  short sVar3;
  U16 UVar4;
  U16 UVar5;
  int iVar6;
  U32 UVar7;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  LZ4_stream_t *pLVar14;
  long lVar15;
  reg_t rVar16;
  reg_t rVar17;
  BYTE *pBVar18;
  char *pcVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  bool bVar22;
  tableType_t tableType_1;
  tableType_t tableType;
  LZ4_stream_t_internal *ctx;
  int acceleration_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  void *state_local;
  int local_1f7c;
  int local_1f34;
  int local_1eec;
  int local_1ea4;
  char *local_1ea0;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *pBStack_1d90;
  U32 startIndex;
  BYTE *ip;
  int result;
  int local_1d40;
  U32 h_6;
  U32 h_4;
  U32 h;
  char *local_1cc8;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *pBStack_1bb8;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_1;
  U32 h_14;
  U32 h_12;
  U32 h_8;
  char *local_1af0;
  size_t accumulator_2;
  size_t lastRun_2;
  U32 matchIndex_5;
  U32 current_5;
  U32 h_23;
  U32 h_19;
  BYTE *ptr_2;
  U32 newMatchCode_2;
  uint more_2;
  BYTE *limit_2;
  uint matchCode_2;
  int len_2;
  uint litLength_2;
  U32 matchIndex_4;
  U32 current_4;
  U32 h_18;
  int searchMatchNb_5;
  int step_5;
  BYTE *forwardIp_5;
  U32 h_17;
  int searchMatchNb_4;
  int step_4;
  BYTE *forwardIp_4;
  BYTE *filledIp_2;
  BYTE *token_2;
  BYTE *match_2;
  U32 forwardH_2;
  U32 offset_2;
  BYTE *olimit_2;
  BYTE *op_2;
  BYTE *dictBase_2;
  BYTE *matchlimit_2;
  BYTE *mflimitPlusOne_2;
  BYTE *iend_2;
  BYTE *anchor_2;
  BYTE *dictEnd_2;
  U32 prefixIdxLimit_2;
  int maybe_extMem_2;
  U32 dictDelta_2;
  U32 dictSize_2;
  BYTE *dictionary_2;
  LZ4_stream_t_internal *dictCtx_2;
  BYTE *lowLimit_2;
  BYTE *base_2;
  BYTE *pBStack_19e0;
  U32 startIndex_2;
  BYTE *ip_2;
  int result_2;
  int local_1990;
  U32 h_22;
  U32 h_20;
  U32 h_16;
  char *local_1918;
  size_t accumulator_3;
  size_t lastRun_3;
  U32 matchIndex_7;
  U32 current_7;
  U32 h_31;
  U32 h_27;
  BYTE *ptr_3;
  U32 newMatchCode_3;
  uint more_3;
  BYTE *limit_3;
  uint matchCode_3;
  int len_3;
  uint litLength_3;
  U32 matchIndex_6;
  U32 current_6;
  U32 h_26;
  int searchMatchNb_7;
  int step_7;
  BYTE *forwardIp_7;
  U32 h_25;
  int searchMatchNb_6;
  int step_6;
  BYTE *forwardIp_6;
  BYTE *filledIp_3;
  BYTE *token_3;
  BYTE *match_3;
  U32 forwardH_3;
  U32 offset_3;
  BYTE *olimit_3;
  BYTE *op_3;
  BYTE *dictBase_3;
  BYTE *matchlimit_3;
  BYTE *mflimitPlusOne_3;
  BYTE *iend_3;
  BYTE *anchor_3;
  BYTE *dictEnd_3;
  U32 prefixIdxLimit_3;
  int maybe_extMem_3;
  U32 dictDelta_3;
  U32 dictSize_3;
  BYTE *dictionary_3;
  LZ4_stream_t_internal *dictCtx_3;
  BYTE *lowLimit_3;
  BYTE *base_3;
  BYTE *pBStack_1808;
  U32 startIndex_3;
  BYTE *ip_3;
  int result_3;
  int local_17b8;
  U32 h_30;
  U32 h_28;
  U32 h_24;
  U16 *hashTable_86;
  U32 *hashTable_85;
  BYTE **hashTable_84;
  U16 *hashTable_101;
  U32 *hashTable_100;
  BYTE **hashTable_99;
  U16 *hashTable_98;
  U32 *hashTable_97;
  BYTE **hashTable_96;
  U16 *hashTable_83;
  U32 *hashTable_82;
  BYTE **hashTable_81;
  U16 *hashTable_59;
  U32 *hashTable_58;
  BYTE **hashTable_57;
  U16 *hashTable_74;
  U32 *hashTable_73;
  BYTE **hashTable_72;
  U16 *hashTable_71;
  U32 *hashTable_70;
  BYTE **hashTable_69;
  U16 *hashTable_56;
  U32 *hashTable_55;
  BYTE **hashTable_54;
  U16 *hashTable_32;
  U32 *hashTable_31;
  BYTE **hashTable_30;
  U16 *hashTable_47;
  U32 *hashTable_46;
  BYTE **hashTable_45;
  U16 *hashTable_44;
  U32 *hashTable_43;
  BYTE **hashTable_42;
  U16 *hashTable_29;
  U32 *hashTable_28;
  BYTE **hashTable_27;
  U16 *hashTable_5;
  U32 *hashTable_4;
  BYTE **hashTable_3;
  U16 *hashTable_20;
  U32 *hashTable_19;
  BYTE **hashTable_18;
  U16 *hashTable_17;
  U32 *hashTable_16;
  BYTE **hashTable_15;
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  U16 *hashTable_90;
  U32 *hashTable_89;
  U16 *hashTable_105;
  U32 *hashTable_104;
  U16 *hashTable_103;
  U32 *hashTable_102;
  U16 *hashTable_88;
  U32 *hashTable_87;
  U16 *hashTable_63;
  U32 *hashTable_62;
  U16 *hashTable_78;
  U32 *hashTable_77;
  U16 *hashTable_76;
  U32 *hashTable_75;
  U16 *hashTable_61;
  U32 *hashTable_60;
  U16 *hashTable_36;
  U32 *hashTable_35;
  U16 *hashTable_51;
  U32 *hashTable_50;
  U16 *hashTable_49;
  U32 *hashTable_48;
  U16 *hashTable_34;
  U32 *hashTable_33;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_24;
  U32 *hashTable_23;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_107;
  U32 *hashTable_106;
  U16 *hashTable_92;
  U32 *hashTable_91;
  U16 *hashTable_80;
  U32 *hashTable_79;
  U16 *hashTable_65;
  U32 *hashTable_64;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U16 *hashTable_26;
  U32 *hashTable_25;
  U16 *hashTable_11;
  U32 *hashTable_10;
  BYTE *e_3;
  BYTE *s_3;
  BYTE *d_3;
  BYTE *e_2;
  BYTE *s_2;
  BYTE *d_2;
  BYTE *e_1;
  BYTE *s_1;
  BYTE *d_1;
  BYTE *e;
  BYTE *s;
  BYTE *d;
  reg_t diff_21;
  reg_t diff_20;
  BYTE *pStart_10;
  reg_t diff_19;
  reg_t diff_18;
  BYTE *pStart_9;
  reg_t diff_23;
  reg_t diff_22;
  BYTE *pStart_11;
  BYTE *local_be8;
  BYTE *local_be0;
  uint local_bd4;
  reg_t diff_15;
  reg_t diff_14;
  BYTE *pStart_7;
  reg_t diff_13;
  reg_t diff_12;
  BYTE *pStart_6;
  reg_t diff_17;
  reg_t diff_16;
  BYTE *pStart_8;
  BYTE *local_b40;
  BYTE *local_b38;
  uint local_b2c;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  BYTE *local_a98;
  BYTE *local_a90;
  uint local_a84;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  BYTE *local_9f0;
  BYTE *local_9e8;
  uint local_9dc;
  U16 *hashTable_95;
  U32 *hashTable_94;
  BYTE **hashTable_93;
  U16 *hashTable_68;
  U32 *hashTable_67;
  BYTE **hashTable_66;
  U16 *hashTable_41;
  U32 *hashTable_40;
  BYTE **hashTable_39;
  U16 *hashTable_14;
  U32 *hashTable_13;
  BYTE **hashTable_12;
  U32 h_29;
  U32 h_21;
  U32 h_13;
  U32 h_5;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes_26;
  U64 prime5bytes_26;
  U32 hashLog_26;
  U64 prime8bytes_36;
  U64 prime5bytes_36;
  U32 hashLog_36;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  uint local_60c;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  uint local_5e4;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  uint local_5bc;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  uint local_594;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  uint local_56c;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  uint local_544;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  U64 prime8bytes_20;
  U64 prime5bytes_20;
  U32 hashLog_20;
  U64 prime8bytes_21;
  U64 prime5bytes_21;
  U32 hashLog_21;
  U64 prime8bytes_23;
  U64 prime5bytes_23;
  U32 hashLog_23;
  U64 prime8bytes_25;
  U64 prime5bytes_25;
  U32 hashLog_25;
  U64 prime8bytes_28;
  U64 prime5bytes_28;
  U32 hashLog_28;
  U64 prime8bytes_29;
  U64 prime5bytes_29;
  U32 hashLog_29;
  U64 prime8bytes_27;
  U64 prime5bytes_27;
  U32 hashLog_27;
  U64 prime8bytes_24;
  U64 prime5bytes_24;
  U32 hashLog_24;
  U64 prime8bytes_22;
  U64 prime5bytes_22;
  U32 hashLog_22;
  U64 prime8bytes_30;
  U64 prime5bytes_30;
  U32 hashLog_30;
  uint local_33c;
  U64 prime8bytes_31;
  U64 prime5bytes_31;
  U32 hashLog_31;
  uint local_314;
  U64 prime8bytes_33;
  U64 prime5bytes_33;
  U32 hashLog_33;
  uint local_2ec;
  U64 prime8bytes_35;
  U64 prime5bytes_35;
  U32 hashLog_35;
  uint local_2c4;
  U64 prime8bytes_38;
  U64 prime5bytes_38;
  U32 hashLog_38;
  uint local_29c;
  U64 prime8bytes_39;
  U64 prime5bytes_39;
  U32 hashLog_39;
  uint local_274;
  U64 prime8bytes_37;
  U64 prime5bytes_37;
  U32 hashLog_37;
  U64 prime8bytes_34;
  U64 prime5bytes_34;
  U32 hashLog_34;
  U64 prime8bytes_32;
  U64 prime5bytes_32;
  U32 hashLog_32;
  
  pLVar14 = LZ4_initStream(state,0x4020);
  ctx._4_4_ = acceleration;
  if (acceleration < 1) {
    ctx._4_4_ = 1;
  }
  if (0x10001 < ctx._4_4_) {
    ctx._4_4_ = 0x10001;
  }
  iVar6 = LZ4_compressBound(inputSize);
  sVar2 = (short)source;
  iVar1 = (int)source;
  local_1d40 = (int)dest;
  if (maxOutputSize < iVar6) {
    if (inputSize < 0x1000b) {
      if ((uint)inputSize < 0x7e000001) {
        if (inputSize == 0) {
          if (maxOutputSize < 1) {
            local_1f34 = 0;
          }
          else {
            *dest = '\0';
            local_1f34 = 1;
          }
        }
        else {
          lVar15 = (long)source - (ulong)(pLVar14->internal_donotuse).currentOffset;
          pBVar18 = (BYTE *)(dest + maxOutputSize);
          if (inputSize < 0x1000b) {
            (pLVar14->internal_donotuse).dictSize =
                 inputSize + (pLVar14->internal_donotuse).dictSize;
            (pLVar14->internal_donotuse).currentOffset =
                 inputSize + (pLVar14->internal_donotuse).currentOffset;
            (pLVar14->internal_donotuse).tableType = 3;
            olimit_2 = (BYTE *)dest;
            iend_2 = (BYTE *)source;
            if (0xc < inputSize) {
              UVar10 = LZ4_read32(source);
              uVar8 = UVar10 * -0x61c8864f >> 0x13;
              sVar3 = (short)lVar15;
              switch(0x47f670) {
              case 0:
                break;
              case 1:
                *(char **)((long)pLVar14 + (ulong)uVar8 * 8) = source;
                break;
              case 2:
                *(int *)((long)pLVar14 + (ulong)uVar8 * 4) = iVar1 - (int)lVar15;
                break;
              case 3:
                *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = sVar2 - sVar3;
              }
              pBStack_19e0 = (BYTE *)(source + 1);
              UVar10 = LZ4_read32(pBStack_19e0);
LAB_0047f81d:
              _searchMatchNb_5 = pBStack_19e0;
              h_18 = 1;
              current_4 = ctx._4_4_ << 6;
              pBVar20 = _searchMatchNb_5;
              do {
                _searchMatchNb_5 = pBVar20;
                match_2._0_4_ = UVar10 * -0x61c8864f >> 0x13;
                pBVar20 = _searchMatchNb_5 + (int)h_18;
                h_18 = (int)current_4 >> 6;
                if (source + (long)inputSize + -0xb < pBVar20) goto LAB_00482047;
                token_2 = (BYTE *)(lVar15 + (ulong)*(ushort *)
                                                    ((long)pLVar14 + (ulong)(uint)match_2 * 2));
                UVar10 = LZ4_read32(pBVar20);
                *(short *)((long)pLVar14 + (ulong)(uint)match_2 * 2) =
                     (short)_searchMatchNb_5 - sVar3;
                UVar9 = LZ4_read32(token_2);
                UVar7 = LZ4_read32(_searchMatchNb_5);
                current_4 = current_4 + 1;
              } while (UVar9 != UVar7);
              pBStack_19e0 = _searchMatchNb_5;
              while( true ) {
                bVar22 = false;
                if (iend_2 < pBStack_19e0 && source < token_2) {
                  bVar22 = pBStack_19e0[-1] == token_2[-1];
                }
                if (!bVar22) break;
                pBStack_19e0 = pBStack_19e0 + -1;
                token_2 = token_2 + -1;
              }
              uVar8 = (int)pBStack_19e0 - (int)iend_2;
              pBVar20 = olimit_2 + 1;
              filledIp_2 = olimit_2;
              if (pBVar20 + (ulong)uVar8 / 0xff + (ulong)uVar8 + 8 <= pBVar18) {
                if (uVar8 < 0xf) {
                  *olimit_2 = (char)uVar8 * '\x10';
                  olimit_2 = pBVar20;
                }
                else {
                  *olimit_2 = 0xf0;
                  olimit_2 = pBVar20;
                  for (limit_2._4_4_ = uVar8 - 0xf; 0xfe < limit_2._4_4_;
                      limit_2._4_4_ = limit_2._4_4_ + -0xff) {
                    *olimit_2 = 0xff;
                    olimit_2 = olimit_2 + 1;
                  }
                  *olimit_2 = (BYTE)limit_2._4_4_;
                  olimit_2 = olimit_2 + 1;
                }
                s_2 = olimit_2;
                e_2 = iend_2;
                do {
                  *(undefined8 *)s_2 = *(undefined8 *)e_2;
                  s_2 = s_2 + 8;
                  e_2 = e_2 + 8;
                } while (s_2 < olimit_2 + uVar8);
                olimit_2 = olimit_2 + uVar8;
                do {
                  pBVar20 = olimit_2;
                  LZ4_writeLE16(olimit_2,(short)pBStack_19e0 - (short)token_2);
                  olimit_2 = olimit_2 + 2;
                  pBVar21 = pBStack_19e0 + 4;
                  local_b40 = token_2 + 4;
                  local_b38 = pBVar21;
                  if (pBVar21 < source + (long)inputSize + -0xc) {
                    rVar16 = LZ4_read_ARCH(local_b40);
                    rVar17 = LZ4_read_ARCH(pBVar21);
                    if ((rVar16 ^ rVar17) == 0) {
                      local_b40 = token_2 + 0xc;
                      local_b38 = pBStack_19e0 + 0xc;
                      goto LAB_00480be4;
                    }
                    local_b2c = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                  }
                  else {
LAB_00480be4:
                    for (; local_b38 < source + (long)inputSize + -0xc; local_b38 = local_b38 + 8) {
                      rVar16 = LZ4_read_ARCH(local_b40);
                      rVar17 = LZ4_read_ARCH(local_b38);
                      if ((rVar16 ^ rVar17) != 0) {
                        uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                        local_b2c = ((int)local_b38 + uVar8) - (int)pBVar21;
                        goto LAB_00480dca;
                      }
                      local_b40 = local_b40 + 8;
                    }
                    if (local_b38 < source + (long)inputSize + -8) {
                      UVar10 = LZ4_read32(local_b40);
                      UVar9 = LZ4_read32(local_b38);
                      if (UVar10 == UVar9) {
                        local_b38 = local_b38 + 4;
                        local_b40 = local_b40 + 4;
                      }
                    }
                    if (local_b38 < source + (long)inputSize + -6) {
                      UVar4 = LZ4_read16(local_b40);
                      UVar5 = LZ4_read16(local_b38);
                      if (UVar4 == UVar5) {
                        local_b38 = local_b38 + 2;
                        local_b40 = local_b40 + 2;
                      }
                    }
                    if ((local_b38 < source + (long)inputSize + -5) && (*local_b40 == *local_b38)) {
                      local_b38 = local_b38 + 1;
                    }
                    local_b2c = (int)local_b38 - (int)pBVar21;
                  }
LAB_00480dca:
                  iend_2 = pBStack_19e0 + (ulong)local_b2c + 4;
                  if (pBVar18 < pBVar20 + (ulong)(local_b2c + 0xf0) / 0xff + 8) {
                    local_1990 = 0;
                    goto LAB_00482258;
                  }
                  if (local_b2c < 0xf) {
                    *filledIp_2 = *filledIp_2 + (char)local_b2c;
                  }
                  else {
                    *filledIp_2 = *filledIp_2 + '\x0f';
                    limit_2._0_4_ = local_b2c - 0xf;
                    LZ4_write32(olimit_2,0xffffffff);
                    for (; 0x3fb < (uint)limit_2; limit_2._0_4_ = (uint)limit_2 - 0x3fc) {
                      olimit_2 = olimit_2 + 4;
                      LZ4_write32(olimit_2,0xffffffff);
                    }
                    pBVar20 = olimit_2 + (ulong)(uint)limit_2 / 0xff;
                    olimit_2 = pBVar20 + 1;
                    *pBVar20 = (BYTE)((ulong)(uint)limit_2 % 0xff);
                  }
                  if (source + (long)inputSize + -0xb <= iend_2) goto LAB_00482047;
                  pBVar20 = iend_2 + -2;
                  UVar10 = LZ4_read32(pBVar20);
                  uVar8 = UVar10 * -0x61c8864f >> 0x13;
                  switch(0x4814ab) {
                  case 0:
                    break;
                  case 1:
                    *(BYTE **)((long)pLVar14 + (ulong)uVar8 * 8) = pBVar20;
                    break;
                  case 2:
                    *(int *)((long)pLVar14 + (ulong)uVar8 * 4) = (int)pBVar20 - (int)lVar15;
                    break;
                  case 3:
                    *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = (short)pBVar20 - sVar3;
                  }
                  UVar10 = LZ4_read32(iend_2);
                  uVar8 = UVar10 * -0x61c8864f >> 0x13;
                  token_2 = (BYTE *)(lVar15 + (ulong)*(ushort *)((long)pLVar14 + (ulong)uVar8 * 2));
                  *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = (short)iend_2 - sVar3;
                  UVar10 = LZ4_read32(token_2);
                  UVar9 = LZ4_read32(iend_2);
                  if (UVar10 != UVar9) goto LAB_00481ecf;
                  filledIp_2 = olimit_2;
                  *olimit_2 = '\0';
                  olimit_2 = olimit_2 + 1;
                  pBStack_19e0 = iend_2;
                } while( true );
              }
              local_1990 = 0;
              goto LAB_00482258;
            }
LAB_00482047:
            pcVar19 = source + ((long)inputSize - (long)iend_2);
            if (pBVar18 < olimit_2 + (long)(pcVar19 + (ulong)(pcVar19 + 0xf0) / 0xff + 1)) {
              local_1990 = 0;
            }
            else {
              if (pcVar19 < (char *)0xf) {
                *olimit_2 = (char)pcVar19 * '\x10';
                olimit_2 = olimit_2 + 1;
              }
              else {
                *olimit_2 = 0xf0;
                pBVar18 = olimit_2;
                for (local_1af0 = pcVar19 + -0xf; olimit_2 = pBVar18 + 1, (char *)0xfe < local_1af0;
                    local_1af0 = local_1af0 + -0xff) {
                  *olimit_2 = 0xff;
                  pBVar18 = olimit_2;
                }
                *olimit_2 = (BYTE)local_1af0;
                olimit_2 = pBVar18 + 2;
              }
              memcpy(olimit_2,iend_2,(size_t)pcVar19);
              local_1990 = ((int)pcVar19 + (int)olimit_2) - local_1d40;
            }
          }
          else {
            local_1990 = 0;
          }
LAB_00482258:
          local_1f34 = local_1990;
        }
      }
      else {
        local_1f34 = 0;
      }
      state_local._4_4_ = local_1f34;
    }
    else {
      if ((uint)inputSize < 0x7e000001) {
        if (inputSize == 0) {
          if (maxOutputSize < 1) {
            local_1f7c = 0;
          }
          else {
            *dest = '\0';
            local_1f7c = 1;
          }
        }
        else {
          lVar15 = (long)source - (ulong)(pLVar14->internal_donotuse).currentOffset;
          pBVar18 = (BYTE *)(dest + maxOutputSize);
          (pLVar14->internal_donotuse).dictSize = inputSize + (pLVar14->internal_donotuse).dictSize;
          (pLVar14->internal_donotuse).currentOffset =
               inputSize + (pLVar14->internal_donotuse).currentOffset;
          (pLVar14->internal_donotuse).tableType = 2;
          olimit_3 = (BYTE *)dest;
          iend_3 = (BYTE *)source;
          if (0xc < inputSize) {
            rVar16 = LZ4_read_ARCH(source);
            uVar8 = LZ4_isLittleEndian();
            if (uVar8 == 0) {
              local_33c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_33c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
            }
            local_33c = local_33c >> 0x14;
            iVar6 = (int)lVar15;
            switch(0x4829e9) {
            case 0:
              break;
            case 1:
              *(char **)((long)pLVar14 + (ulong)local_33c * 8) = source;
              break;
            case 2:
              *(int *)((long)pLVar14 + (ulong)local_33c * 4) = iVar1 - iVar6;
              break;
            case 3:
              *(short *)((long)pLVar14 + (ulong)local_33c * 2) = sVar2 - (short)lVar15;
            }
            pBStack_1808 = (BYTE *)(source + 1);
            rVar16 = LZ4_read_ARCH(pBStack_1808);
            uVar8 = LZ4_isLittleEndian();
            if (uVar8 == 0) {
              local_314 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_314 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
            }
            local_314 = local_314 >> 0x14;
            match_3._0_4_ = local_314;
LAB_00482bb1:
            _searchMatchNb_7 = pBStack_1808;
            h_26 = 1;
            current_6 = ctx._4_4_ << 6;
            pBVar20 = _searchMatchNb_7;
            do {
              do {
                _searchMatchNb_7 = pBVar20;
                uVar13 = (uint)match_3;
                uVar11 = (int)_searchMatchNb_7 - iVar6;
                uVar8 = *(uint *)((long)pLVar14 + (ulong)(uint)match_3 * 4);
                pBVar20 = _searchMatchNb_7 + (int)h_26;
                UVar10 = current_6 + 1;
                h_26 = (int)current_6 >> 6;
                if (source + (long)inputSize + -0xb < pBVar20) goto LAB_0048533c;
                token_3 = (BYTE *)(lVar15 + (ulong)uVar8);
                rVar16 = LZ4_read_ARCH(pBVar20);
                uVar12 = LZ4_isLittleEndian();
                if (uVar12 == 0) {
                  local_2ec = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_2ec = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                }
                local_2ec = local_2ec >> 0x14;
                match_3._0_4_ = local_2ec;
                *(uint *)((long)pLVar14 + (ulong)uVar13 * 4) = uVar11;
                current_6 = UVar10;
              } while (uVar8 + 0xffff < uVar11);
              UVar10 = LZ4_read32(token_3);
              UVar9 = LZ4_read32(_searchMatchNb_7);
            } while (UVar10 != UVar9);
            pBStack_1808 = _searchMatchNb_7;
            while( true ) {
              bVar22 = false;
              if (iend_3 < pBStack_1808 && source < token_3) {
                bVar22 = pBStack_1808[-1] == token_3[-1];
              }
              if (!bVar22) break;
              pBStack_1808 = pBStack_1808 + -1;
              token_3 = token_3 + -1;
            }
            uVar8 = (int)pBStack_1808 - (int)iend_3;
            pBVar20 = olimit_3 + 1;
            filledIp_3 = olimit_3;
            if (pBVar20 + (ulong)uVar8 / 0xff + (ulong)uVar8 + 8 <= pBVar18) {
              if (uVar8 < 0xf) {
                *olimit_3 = (char)uVar8 * '\x10';
                olimit_3 = pBVar20;
              }
              else {
                *olimit_3 = 0xf0;
                olimit_3 = pBVar20;
                for (limit_3._4_4_ = uVar8 - 0xf; 0xfe < limit_3._4_4_;
                    limit_3._4_4_ = limit_3._4_4_ + -0xff) {
                  *olimit_3 = 0xff;
                  olimit_3 = olimit_3 + 1;
                }
                *olimit_3 = (BYTE)limit_3._4_4_;
                olimit_3 = olimit_3 + 1;
              }
              s_3 = olimit_3;
              e_3 = iend_3;
              do {
                *(undefined8 *)s_3 = *(undefined8 *)e_3;
                s_3 = s_3 + 8;
                e_3 = e_3 + 8;
              } while (s_3 < olimit_3 + uVar8);
              olimit_3 = olimit_3 + uVar8;
              do {
                pBVar20 = olimit_3;
                LZ4_writeLE16(olimit_3,(short)pBStack_1808 - (short)token_3);
                olimit_3 = olimit_3 + 2;
                pBVar21 = pBStack_1808 + 4;
                local_be8 = token_3 + 4;
                local_be0 = pBVar21;
                if (pBVar21 < source + (long)inputSize + -0xc) {
                  rVar16 = LZ4_read_ARCH(local_be8);
                  rVar17 = LZ4_read_ARCH(pBVar21);
                  if ((rVar16 ^ rVar17) == 0) {
                    local_be8 = token_3 + 0xc;
                    local_be0 = pBStack_1808 + 0xc;
                    goto LAB_00483f51;
                  }
                  local_bd4 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                }
                else {
LAB_00483f51:
                  for (; local_be0 < source + (long)inputSize + -0xc; local_be0 = local_be0 + 8) {
                    rVar16 = LZ4_read_ARCH(local_be8);
                    rVar17 = LZ4_read_ARCH(local_be0);
                    if ((rVar16 ^ rVar17) != 0) {
                      uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                      local_bd4 = ((int)local_be0 + uVar8) - (int)pBVar21;
                      goto LAB_00484137;
                    }
                    local_be8 = local_be8 + 8;
                  }
                  if (local_be0 < source + (long)inputSize + -8) {
                    UVar10 = LZ4_read32(local_be8);
                    UVar9 = LZ4_read32(local_be0);
                    if (UVar10 == UVar9) {
                      local_be0 = local_be0 + 4;
                      local_be8 = local_be8 + 4;
                    }
                  }
                  if (local_be0 < source + (long)inputSize + -6) {
                    UVar4 = LZ4_read16(local_be8);
                    UVar5 = LZ4_read16(local_be0);
                    if (UVar4 == UVar5) {
                      local_be0 = local_be0 + 2;
                      local_be8 = local_be8 + 2;
                    }
                  }
                  if ((local_be0 < source + (long)inputSize + -5) && (*local_be8 == *local_be0)) {
                    local_be0 = local_be0 + 1;
                  }
                  local_bd4 = (int)local_be0 - (int)pBVar21;
                }
LAB_00484137:
                iend_3 = pBStack_1808 + (ulong)local_bd4 + 4;
                if (pBVar18 < pBVar20 + (ulong)(local_bd4 + 0xf0) / 0xff + 8) {
                  local_17b8 = 0;
                  goto LAB_0048554d;
                }
                if (local_bd4 < 0xf) {
                  *filledIp_3 = *filledIp_3 + (char)local_bd4;
                }
                else {
                  *filledIp_3 = *filledIp_3 + '\x0f';
                  limit_3._0_4_ = local_bd4 - 0xf;
                  LZ4_write32(olimit_3,0xffffffff);
                  for (; 0x3fb < (uint)limit_3; limit_3._0_4_ = (uint)limit_3 - 0x3fc) {
                    olimit_3 = olimit_3 + 4;
                    LZ4_write32(olimit_3,0xffffffff);
                  }
                  pBVar20 = olimit_3 + (ulong)(uint)limit_3 / 0xff;
                  olimit_3 = pBVar20 + 1;
                  *pBVar20 = (BYTE)((ulong)(uint)limit_3 % 0xff);
                }
                if (source + (long)inputSize + -0xb <= iend_3) goto LAB_0048533c;
                pBVar20 = iend_3 + -2;
                rVar16 = LZ4_read_ARCH(pBVar20);
                uVar8 = LZ4_isLittleEndian();
                if (uVar8 == 0) {
                  local_2c4 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_2c4 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                }
                local_2c4 = local_2c4 >> 0x14;
                switch(0x4847b5) {
                case 0:
                  break;
                case 1:
                  *(BYTE **)((long)pLVar14 + (ulong)local_2c4 * 8) = pBVar20;
                  break;
                case 2:
                  *(int *)((long)pLVar14 + (ulong)local_2c4 * 4) = (int)pBVar20 - iVar6;
                  break;
                case 3:
                  *(short *)((long)pLVar14 + (ulong)local_2c4 * 2) = (short)pBVar20 - (short)lVar15;
                }
                rVar16 = LZ4_read_ARCH(iend_3);
                uVar8 = LZ4_isLittleEndian();
                if (uVar8 == 0) {
                  local_29c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_29c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
                }
                local_29c = local_29c >> 0x14;
                uVar13 = (int)iend_3 - iVar6;
                uVar8 = *(uint *)((long)pLVar14 + (ulong)local_29c * 4);
                token_3 = (BYTE *)(lVar15 + (ulong)uVar8);
                *(uint *)((long)pLVar14 + (ulong)local_29c * 4) = uVar13;
                if (uVar8 + 0xffff < uVar13) goto LAB_004851da;
                UVar10 = LZ4_read32(token_3);
                UVar9 = LZ4_read32(iend_3);
                if (UVar10 != UVar9) goto LAB_004851da;
                filledIp_3 = olimit_3;
                *olimit_3 = '\0';
                olimit_3 = olimit_3 + 1;
                pBStack_1808 = iend_3;
              } while( true );
            }
            local_17b8 = 0;
            goto LAB_0048554d;
          }
LAB_0048533c:
          pcVar19 = source + ((long)inputSize - (long)iend_3);
          if (pBVar18 < olimit_3 + (long)(pcVar19 + (ulong)(pcVar19 + 0xf0) / 0xff + 1)) {
            local_17b8 = 0;
          }
          else {
            if (pcVar19 < (char *)0xf) {
              *olimit_3 = (char)pcVar19 * '\x10';
              olimit_3 = olimit_3 + 1;
            }
            else {
              *olimit_3 = 0xf0;
              pBVar18 = olimit_3;
              for (local_1918 = pcVar19 + -0xf; olimit_3 = pBVar18 + 1, (char *)0xfe < local_1918;
                  local_1918 = local_1918 + -0xff) {
                *olimit_3 = 0xff;
                pBVar18 = olimit_3;
              }
              *olimit_3 = (BYTE)local_1918;
              olimit_3 = pBVar18 + 2;
            }
            memcpy(olimit_3,iend_3,(size_t)pcVar19);
            local_17b8 = ((int)pcVar19 + (int)olimit_3) - local_1d40;
          }
LAB_0048554d:
          local_1f7c = local_17b8;
        }
      }
      else {
        local_1f7c = 0;
      }
      state_local._4_4_ = local_1f7c;
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize == 0) {
        *dest = '\0';
        local_1ea4 = 1;
      }
      else {
        lVar15 = (long)source - (ulong)(pLVar14->internal_donotuse).currentOffset;
        if (inputSize < 0x1000b) {
          (pLVar14->internal_donotuse).dictSize = inputSize + (pLVar14->internal_donotuse).dictSize;
          (pLVar14->internal_donotuse).currentOffset =
               inputSize + (pLVar14->internal_donotuse).currentOffset;
          (pLVar14->internal_donotuse).tableType = 3;
          olimit = (BYTE *)dest;
          iend = (BYTE *)source;
          if (0xc < inputSize) {
            UVar10 = LZ4_read32(source);
            uVar8 = UVar10 * -0x61c8864f >> 0x13;
            sVar3 = (short)lVar15;
            switch(0x478ed2) {
            case 0:
              break;
            case 1:
              *(char **)((long)pLVar14 + (ulong)uVar8 * 8) = source;
              break;
            case 2:
              *(int *)((long)pLVar14 + (ulong)uVar8 * 4) = iVar1 - (int)lVar15;
              break;
            case 3:
              *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = sVar2 - sVar3;
            }
            pBStack_1d90 = (BYTE *)(source + 1);
            UVar10 = LZ4_read32(pBStack_1d90);
LAB_0047907f:
            _searchMatchNb_1 = pBStack_1d90;
            h_2 = 1;
            current = ctx._4_4_ << 6;
            pBVar18 = _searchMatchNb_1;
            do {
              _searchMatchNb_1 = pBVar18;
              match._0_4_ = UVar10 * -0x61c8864f >> 0x13;
              pBVar18 = _searchMatchNb_1 + (int)h_2;
              h_2 = (int)current >> 6;
              if (source + (long)inputSize + -0xb < pBVar18) goto LAB_0047b8b2;
              token = (BYTE *)(lVar15 + (ulong)*(ushort *)((long)pLVar14 + (ulong)(uint)match * 2));
              UVar10 = LZ4_read32(pBVar18);
              *(short *)((long)pLVar14 + (ulong)(uint)match * 2) = (short)_searchMatchNb_1 - sVar3;
              UVar9 = LZ4_read32(token);
              UVar7 = LZ4_read32(_searchMatchNb_1);
              current = current + 1;
            } while (UVar9 != UVar7);
            pBStack_1d90 = _searchMatchNb_1;
            while( true ) {
              bVar22 = false;
              if (iend < pBStack_1d90 && source < token) {
                bVar22 = pBStack_1d90[-1] == token[-1];
              }
              if (!bVar22) break;
              pBStack_1d90 = pBStack_1d90 + -1;
              token = token + -1;
            }
            uVar8 = (int)pBStack_1d90 - (int)iend;
            filledIp = olimit;
            if (uVar8 < 0xf) {
              *olimit = (char)uVar8 * '\x10';
              olimit = olimit + 1;
            }
            else {
              *olimit = 0xf0;
              olimit = olimit + 1;
              for (limit._4_4_ = uVar8 - 0xf; 0xfe < limit._4_4_; limit._4_4_ = limit._4_4_ + -0xff)
              {
                *olimit = 0xff;
                olimit = olimit + 1;
              }
              *olimit = (BYTE)limit._4_4_;
              olimit = olimit + 1;
            }
            s = olimit;
            e = iend;
            do {
              *(undefined8 *)s = *(undefined8 *)e;
              s = s + 8;
              e = e + 8;
            } while (s < olimit + uVar8);
            olimit = olimit + uVar8;
            do {
              LZ4_writeLE16(olimit,(short)pBStack_1d90 - (short)token);
              olimit = olimit + 2;
              pBVar18 = pBStack_1d90 + 4;
              local_9f0 = token + 4;
              local_9e8 = pBVar18;
              if (pBVar18 < source + (long)inputSize + -0xc) {
                rVar16 = LZ4_read_ARCH(local_9f0);
                rVar17 = LZ4_read_ARCH(pBVar18);
                if ((rVar16 ^ rVar17) == 0) {
                  local_9f0 = token + 0xc;
                  local_9e8 = pBStack_1d90 + 0xc;
                  goto LAB_0047a44f;
                }
                local_9dc = LZ4_NbCommonBytes(rVar16 ^ rVar17);
              }
              else {
LAB_0047a44f:
                for (; local_9e8 < source + (long)inputSize + -0xc; local_9e8 = local_9e8 + 8) {
                  rVar16 = LZ4_read_ARCH(local_9f0);
                  rVar17 = LZ4_read_ARCH(local_9e8);
                  if ((rVar16 ^ rVar17) != 0) {
                    uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                    local_9dc = ((int)local_9e8 + uVar8) - (int)pBVar18;
                    goto LAB_0047a635;
                  }
                  local_9f0 = local_9f0 + 8;
                }
                if (local_9e8 < source + (long)inputSize + -8) {
                  UVar10 = LZ4_read32(local_9f0);
                  UVar9 = LZ4_read32(local_9e8);
                  if (UVar10 == UVar9) {
                    local_9e8 = local_9e8 + 4;
                    local_9f0 = local_9f0 + 4;
                  }
                }
                if (local_9e8 < source + (long)inputSize + -6) {
                  UVar4 = LZ4_read16(local_9f0);
                  UVar5 = LZ4_read16(local_9e8);
                  if (UVar4 == UVar5) {
                    local_9e8 = local_9e8 + 2;
                    local_9f0 = local_9f0 + 2;
                  }
                }
                if ((local_9e8 < source + (long)inputSize + -5) && (*local_9f0 == *local_9e8)) {
                  local_9e8 = local_9e8 + 1;
                }
                local_9dc = (int)local_9e8 - (int)pBVar18;
              }
LAB_0047a635:
              iend = pBStack_1d90 + (ulong)local_9dc + 4;
              if (local_9dc < 0xf) {
                *filledIp = *filledIp + (char)local_9dc;
              }
              else {
                *filledIp = *filledIp + '\x0f';
                limit._0_4_ = local_9dc - 0xf;
                LZ4_write32(olimit,0xffffffff);
                for (; 0x3fb < (uint)limit; limit._0_4_ = (uint)limit - 0x3fc) {
                  olimit = olimit + 4;
                  LZ4_write32(olimit,0xffffffff);
                }
                pBVar18 = olimit + (ulong)(uint)limit / 0xff;
                olimit = pBVar18 + 1;
                *pBVar18 = (BYTE)((ulong)(uint)limit % 0xff);
              }
              if (source + (long)inputSize + -0xb <= iend) break;
              pBVar18 = iend + -2;
              UVar10 = LZ4_read32(pBVar18);
              uVar8 = UVar10 * -0x61c8864f >> 0x13;
              switch(0x47ad16) {
              case 0:
                break;
              case 1:
                *(BYTE **)((long)pLVar14 + (ulong)uVar8 * 8) = pBVar18;
                break;
              case 2:
                *(int *)((long)pLVar14 + (ulong)uVar8 * 4) = (int)pBVar18 - (int)lVar15;
                break;
              case 3:
                *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = (short)pBVar18 - sVar3;
              }
              UVar10 = LZ4_read32(iend);
              uVar8 = UVar10 * -0x61c8864f >> 0x13;
              token = (BYTE *)(lVar15 + (ulong)*(ushort *)((long)pLVar14 + (ulong)uVar8 * 2));
              *(short *)((long)pLVar14 + (ulong)uVar8 * 2) = (short)iend - sVar3;
              UVar10 = LZ4_read32(token);
              UVar9 = LZ4_read32(iend);
              if (UVar10 != UVar9) goto LAB_0047b73a;
              filledIp = olimit;
              *olimit = '\0';
              olimit = olimit + 1;
              pBStack_1d90 = iend;
            } while( true );
          }
LAB_0047b8b2:
          pcVar19 = source + ((long)inputSize - (long)iend);
          if (pcVar19 < (char *)0xf) {
            *olimit = (char)pcVar19 * '\x10';
            olimit = olimit + 1;
          }
          else {
            *olimit = 0xf0;
            pBVar18 = olimit;
            for (local_1ea0 = pcVar19 + -0xf; olimit = pBVar18 + 1, (char *)0xfe < local_1ea0;
                local_1ea0 = local_1ea0 + -0xff) {
              *olimit = 0xff;
              pBVar18 = olimit;
            }
            *olimit = (BYTE)local_1ea0;
            olimit = pBVar18 + 2;
          }
          memcpy(olimit,iend,(size_t)pcVar19);
          local_1d40 = ((int)pcVar19 + (int)olimit) - local_1d40;
        }
        else {
          local_1d40 = 0;
        }
        local_1ea4 = local_1d40;
      }
    }
    else {
      local_1ea4 = 0;
    }
    state_local._4_4_ = local_1ea4;
  }
  else {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize == 0) {
        *dest = '\0';
        local_1eec = 1;
      }
      else {
        lVar15 = (long)source - (ulong)(pLVar14->internal_donotuse).currentOffset;
        (pLVar14->internal_donotuse).dictSize = inputSize + (pLVar14->internal_donotuse).dictSize;
        (pLVar14->internal_donotuse).currentOffset =
             inputSize + (pLVar14->internal_donotuse).currentOffset;
        (pLVar14->internal_donotuse).tableType = 2;
        olimit_1 = (BYTE *)dest;
        iend_1 = (BYTE *)source;
        if (0xc < inputSize) {
          rVar16 = LZ4_read_ARCH(source);
          uVar8 = LZ4_isLittleEndian();
          if (uVar8 == 0) {
            local_60c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_60c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
          }
          local_60c = local_60c >> 0x14;
          iVar6 = (int)lVar15;
          switch(0x47c26a) {
          case 0:
            break;
          case 1:
            *(char **)((long)pLVar14 + (ulong)local_60c * 8) = source;
            break;
          case 2:
            *(int *)((long)pLVar14 + (ulong)local_60c * 4) = iVar1 - iVar6;
            break;
          case 3:
            *(short *)((long)pLVar14 + (ulong)local_60c * 2) = sVar2 - (short)lVar15;
          }
          pBStack_1bb8 = (BYTE *)(source + 1);
          rVar16 = LZ4_read_ARCH(pBStack_1bb8);
          uVar8 = LZ4_isLittleEndian();
          if (uVar8 == 0) {
            local_5e4 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_5e4 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
          }
          local_5e4 = local_5e4 >> 0x14;
          match_1._0_4_ = local_5e4;
LAB_0047c44a:
          _searchMatchNb_3 = pBStack_1bb8;
          h_10 = 1;
          current_2 = ctx._4_4_ << 6;
          pBVar18 = _searchMatchNb_3;
          do {
            do {
              _searchMatchNb_3 = pBVar18;
              uVar13 = (uint)match_1;
              uVar11 = (int)_searchMatchNb_3 - iVar6;
              uVar8 = *(uint *)((long)pLVar14 + (ulong)(uint)match_1 * 4);
              pBVar18 = _searchMatchNb_3 + (int)h_10;
              UVar10 = current_2 + 1;
              h_10 = (int)current_2 >> 6;
              if (source + (long)inputSize + -0xb < pBVar18) goto LAB_0047ec7d;
              token_1 = (BYTE *)(lVar15 + (ulong)uVar8);
              rVar16 = LZ4_read_ARCH(pBVar18);
              uVar12 = LZ4_isLittleEndian();
              if (uVar12 == 0) {
                local_5bc = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_5bc = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
              }
              local_5bc = local_5bc >> 0x14;
              match_1._0_4_ = local_5bc;
              *(uint *)((long)pLVar14 + (ulong)uVar13 * 4) = uVar11;
              current_2 = UVar10;
            } while (uVar8 + 0xffff < uVar11);
            UVar10 = LZ4_read32(token_1);
            UVar9 = LZ4_read32(_searchMatchNb_3);
          } while (UVar10 != UVar9);
          pBStack_1bb8 = _searchMatchNb_3;
          while( true ) {
            bVar22 = false;
            if (iend_1 < pBStack_1bb8 && source < token_1) {
              bVar22 = pBStack_1bb8[-1] == token_1[-1];
            }
            if (!bVar22) break;
            pBStack_1bb8 = pBStack_1bb8 + -1;
            token_1 = token_1 + -1;
          }
          uVar8 = (int)pBStack_1bb8 - (int)iend_1;
          filledIp_1 = olimit_1;
          if (uVar8 < 0xf) {
            *olimit_1 = (char)uVar8 * '\x10';
            olimit_1 = olimit_1 + 1;
          }
          else {
            *olimit_1 = 0xf0;
            olimit_1 = olimit_1 + 1;
            for (limit_1._4_4_ = uVar8 - 0xf; 0xfe < limit_1._4_4_;
                limit_1._4_4_ = limit_1._4_4_ + -0xff) {
              *olimit_1 = 0xff;
              olimit_1 = olimit_1 + 1;
            }
            *olimit_1 = (BYTE)limit_1._4_4_;
            olimit_1 = olimit_1 + 1;
          }
          s_1 = olimit_1;
          e_1 = iend_1;
          do {
            *(undefined8 *)s_1 = *(undefined8 *)e_1;
            s_1 = s_1 + 8;
            e_1 = e_1 + 8;
          } while (s_1 < olimit_1 + uVar8);
          olimit_1 = olimit_1 + uVar8;
          do {
            LZ4_writeLE16(olimit_1,(short)pBStack_1bb8 - (short)token_1);
            olimit_1 = olimit_1 + 2;
            pBVar18 = pBStack_1bb8 + 4;
            local_a98 = token_1 + 4;
            local_a90 = pBVar18;
            if (pBVar18 < source + (long)inputSize + -0xc) {
              rVar16 = LZ4_read_ARCH(local_a98);
              rVar17 = LZ4_read_ARCH(pBVar18);
              if ((rVar16 ^ rVar17) == 0) {
                local_a98 = token_1 + 0xc;
                local_a90 = pBStack_1bb8 + 0xc;
                goto LAB_0047d81a;
              }
              local_a84 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
            }
            else {
LAB_0047d81a:
              for (; local_a90 < source + (long)inputSize + -0xc; local_a90 = local_a90 + 8) {
                rVar16 = LZ4_read_ARCH(local_a98);
                rVar17 = LZ4_read_ARCH(local_a90);
                if ((rVar16 ^ rVar17) != 0) {
                  uVar8 = LZ4_NbCommonBytes(rVar16 ^ rVar17);
                  local_a84 = ((int)local_a90 + uVar8) - (int)pBVar18;
                  goto LAB_0047da00;
                }
                local_a98 = local_a98 + 8;
              }
              if (local_a90 < source + (long)inputSize + -8) {
                UVar10 = LZ4_read32(local_a98);
                UVar9 = LZ4_read32(local_a90);
                if (UVar10 == UVar9) {
                  local_a90 = local_a90 + 4;
                  local_a98 = local_a98 + 4;
                }
              }
              if (local_a90 < source + (long)inputSize + -6) {
                UVar4 = LZ4_read16(local_a98);
                UVar5 = LZ4_read16(local_a90);
                if (UVar4 == UVar5) {
                  local_a90 = local_a90 + 2;
                  local_a98 = local_a98 + 2;
                }
              }
              if ((local_a90 < source + (long)inputSize + -5) && (*local_a98 == *local_a90)) {
                local_a90 = local_a90 + 1;
              }
              local_a84 = (int)local_a90 - (int)pBVar18;
            }
LAB_0047da00:
            iend_1 = pBStack_1bb8 + (ulong)local_a84 + 4;
            if (local_a84 < 0xf) {
              *filledIp_1 = *filledIp_1 + (char)local_a84;
            }
            else {
              *filledIp_1 = *filledIp_1 + '\x0f';
              limit_1._0_4_ = local_a84 - 0xf;
              LZ4_write32(olimit_1,0xffffffff);
              for (; 0x3fb < (uint)limit_1; limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
                olimit_1 = olimit_1 + 4;
                LZ4_write32(olimit_1,0xffffffff);
              }
              pBVar18 = olimit_1 + (ulong)(uint)limit_1 / 0xff;
              olimit_1 = pBVar18 + 1;
              *pBVar18 = (BYTE)((ulong)(uint)limit_1 % 0xff);
            }
            if (source + (long)inputSize + -0xb <= iend_1) break;
            pBVar18 = iend_1 + -2;
            rVar16 = LZ4_read_ARCH(pBVar18);
            uVar8 = LZ4_isLittleEndian();
            if (uVar8 == 0) {
              local_594 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_594 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
            }
            local_594 = local_594 >> 0x14;
            switch(0x47e0ae) {
            case 0:
              break;
            case 1:
              *(BYTE **)((long)pLVar14 + (ulong)local_594 * 8) = pBVar18;
              break;
            case 2:
              *(int *)((long)pLVar14 + (ulong)local_594 * 4) = (int)pBVar18 - iVar6;
              break;
            case 3:
              *(short *)((long)pLVar14 + (ulong)local_594 * 2) = (short)pBVar18 - (short)lVar15;
            }
            rVar16 = LZ4_read_ARCH(iend_1);
            uVar8 = LZ4_isLittleEndian();
            if (uVar8 == 0) {
              local_56c = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_56c = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
            }
            local_56c = local_56c >> 0x14;
            uVar13 = (int)iend_1 - iVar6;
            uVar8 = *(uint *)((long)pLVar14 + (ulong)local_56c * 4);
            token_1 = (BYTE *)(lVar15 + (ulong)uVar8);
            *(uint *)((long)pLVar14 + (ulong)local_56c * 4) = uVar13;
            if (uVar8 + 0xffff < uVar13) goto LAB_0047eb03;
            UVar10 = LZ4_read32(token_1);
            UVar9 = LZ4_read32(iend_1);
            if (UVar10 != UVar9) goto LAB_0047eb03;
            filledIp_1 = olimit_1;
            *olimit_1 = '\0';
            olimit_1 = olimit_1 + 1;
            pBStack_1bb8 = iend_1;
          } while( true );
        }
LAB_0047ec7d:
        pcVar19 = source + ((long)inputSize - (long)iend_1);
        if (pcVar19 < (char *)0xf) {
          *olimit_1 = (char)pcVar19 * '\x10';
          olimit_1 = olimit_1 + 1;
        }
        else {
          *olimit_1 = 0xf0;
          pBVar18 = olimit_1;
          for (local_1cc8 = pcVar19 + -0xf; olimit_1 = pBVar18 + 1, (char *)0xfe < local_1cc8;
              local_1cc8 = local_1cc8 + -0xff) {
            *olimit_1 = 0xff;
            pBVar18 = olimit_1;
          }
          *olimit_1 = (BYTE)local_1cc8;
          olimit_1 = pBVar18 + 2;
        }
        memcpy(olimit_1,iend_1,(size_t)pcVar19);
        local_1eec = ((int)pcVar19 + (int)olimit_1) - local_1d40;
      }
    }
    else {
      local_1eec = 0;
    }
    state_local._4_4_ = local_1eec;
  }
  return state_local._4_4_;
LAB_004851da:
  pBStack_1808 = iend_3 + 1;
  rVar16 = LZ4_read_ARCH(pBStack_1808);
  uVar8 = LZ4_isLittleEndian();
  if (uVar8 == 0) {
    local_274 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_274 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
  }
  local_274 = local_274 >> 0x14;
  match_3._0_4_ = local_274;
  goto LAB_00482bb1;
LAB_00481ecf:
  pBStack_19e0 = iend_2 + 1;
  UVar10 = LZ4_read32(pBStack_19e0);
  goto LAB_0047f81d;
LAB_0047eb03:
  pBStack_1bb8 = iend_1 + 1;
  rVar16 = LZ4_read_ARCH(pBStack_1bb8);
  uVar8 = LZ4_isLittleEndian();
  if (uVar8 == 0) {
    local_544 = (uint)((rVar16 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_544 = (uint)(rVar16 * -0x30e4432345000000 >> 0x20);
  }
  local_544 = local_544 >> 0x14;
  match_1._0_4_ = local_544;
  goto LAB_0047c44a;
LAB_0047b73a:
  pBStack_1d90 = iend + 1;
  UVar10 = LZ4_read32(pBStack_1d90);
  goto LAB_0047907f;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}